

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O2

void __thiscall QLocalServerPrivate::closeServer(QLocalServerPrivate *this)

{
  parameter_type pQVar1;
  
  if (this->socketNotifier != (QSocketNotifier *)0x0) {
    QSocketNotifier::setEnabled(SUB81(this->socketNotifier,0));
    QObject::deleteLater();
    this->socketNotifier = (QSocketNotifier *)0x0;
  }
  if (this->listenSocket != -1) {
    qt_safe_close(this->listenSocket);
  }
  this->listenSocket = -1;
  if ((this->fullServerName).d.size != 0) {
    pQVar1 = QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
             ::value(&this->socketOptions);
    if (((pQVar1->super_QFlagsStorageHelper<QLocalServer::SocketOption,_4>).
         super_QFlagsStorage<QLocalServer::SocketOption>.i & 8) == 0) {
      QFile::remove((QString *)&this->fullServerName);
    }
  }
  QString::clear(&this->serverName);
  QString::clear(&this->fullServerName);
  return;
}

Assistant:

void QLocalServerPrivate::closeServer()
{
    if (socketNotifier) {
        socketNotifier->setEnabled(false); // Otherwise, closed socket is checked before deleter runs
        socketNotifier->deleteLater();
        socketNotifier = nullptr;
    }

    if (-1 != listenSocket)
        QT_CLOSE(listenSocket);
    listenSocket = -1;

    if (!fullServerName.isEmpty()
        && !optionsForPlatform(socketOptions).testFlag(QLocalServer::AbstractNamespaceOption)) {
        QFile::remove(fullServerName);
    }

    serverName.clear();
    fullServerName.clear();
}